

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O3

ExpectedRef<const_Sequence,_std::string> * __thiscall
yaml::Value::getSequence_abi_cxx11_
          (ExpectedRef<const_Sequence,_std::string> *__return_storage_ptr__,Value *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *local_58;
  size_type local_50;
  vector<yaml::Value,_std::allocator<yaml::Value>_> local_48;
  pointer pVStack_20;
  
  if (this->type_ == Sequence) {
    (__return_storage_ptr__->field_0).value_._M_data = &this->sequence_;
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    local_58 = &local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Value is not of Sequence type","");
    if (local_58 == &local_48) {
      pVStack_20 = local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_58 = (vector<yaml::Value,_std::allocator<yaml::Value>_> *)&stack0xffffffffffffffd8;
    }
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_58 == (vector<yaml::Value,_std::allocator<yaml::Value>_> *)&stack0xffffffffffffffd8) {
      paVar1->_M_allocated_capacity =
           (size_type)
           local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) = pVStack_20;
    }
    else {
      (__return_storage_ptr__->field_0).value_._M_data = local_58;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           (size_type)
           local_48.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_50;
    __return_storage_ptr__->has_value_ = false;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpectedRef<const Sequence, std::string> getSequence() const {
		if (type_ != Type::Sequence)
			return Unexpected<std::string>("Value is not of Sequence type");
		return std::cref(sequence_);
	}